

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a0d736::HandleDirectoryMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  undefined8 this;
  PolicyStatus PVar1;
  ulong uVar2;
  cmMakefile *pcVar3;
  string *in_base;
  cmGlobalGenerator *this_00;
  char *value;
  cmValue value_00;
  PolicyID id;
  bool bVar4;
  string local_b8;
  uint local_98;
  allocator<char> local_91;
  string local_90;
  undefined1 local_60 [8];
  string dir;
  cmMakefile *mf;
  string *propertyName_local;
  string *variable_local;
  OutType infoType_local;
  string *name_local;
  cmExecutionStatus *status_local;
  
  dir.field_2._8_8_ = cmExecutionStatus::GetMakefile(status);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
    cmsys::SystemTools::CollapseFullPath((string *)local_60,name,in_base);
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    this_00 = cmMakefile::GetGlobalGenerator(pcVar3);
    dir.field_2._8_8_ = cmGlobalGenerator::FindMakefile(this_00,(string *)local_60);
    bVar4 = (cmMakefile *)dir.field_2._8_8_ == (cmMakefile *)0x0;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_91);
      cmExecutionStatus::SetError(status,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      status_local._7_1_ = 0;
    }
    local_98 = (uint)bVar4;
    std::__cxx11::string::~string((string *)local_60);
    if (local_98 != 0) goto LAB_005f2f9d;
  }
  bVar4 = std::operator==(propertyName,"DEFINITIONS");
  if (bVar4) {
    PVar1 = cmMakefile::GetPolicyStatus((cmMakefile *)dir.field_2._8_8_,CMP0059,false);
    this = dir.field_2._8_8_;
    if (PVar1 != OLD) {
      if (PVar1 != WARN) goto LAB_005f2f40;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b8,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage((cmMakefile *)this,AUTHOR_WARNING,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    value = cmMakefile::GetDefineFlagsCMP0059((cmMakefile *)dir.field_2._8_8_);
    status_local._7_1_ =
         (anonymous_namespace)::StoreResult<char_const*>(infoType,pcVar3,variable,value);
  }
  else {
LAB_005f2f40:
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    value_00 = cmMakefile::GetProperty((cmMakefile *)dir.field_2._8_8_,propertyName);
    status_local._7_1_ = StoreResult<cmValue>(infoType,pcVar3,variable,value_00);
  }
LAB_005f2f9d:
  return (bool)(status_local._7_1_ & 1);
}

Assistant:

bool HandleDirectoryMode(cmExecutionStatus& status, const std::string& name,
                         OutType infoType, const std::string& variable,
                         const std::string& propertyName)
{
  // Default to the current directory.
  cmMakefile* mf = &status.GetMakefile();

  // Lookup the directory if given.
  if (!name.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = cmSystemTools::CollapseFullPath(
      name, status.GetMakefile().GetCurrentSourceDirectory());

    // Lookup the generator.
    mf = status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      status.SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  if (propertyName == "DEFINITIONS") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0059)) {
      case cmPolicies::WARN:
        mf->IssueMessage(MessageType::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return StoreResult(infoType, status.GetMakefile(), variable,
                           mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
    }
  }

  // Get the property.
  return StoreResult(infoType, status.GetMakefile(), variable,
                     mf->GetProperty(propertyName));
}